

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNativeOperators.cpp
# Opt level: O0

void dummy_Op_GetElementI_UInt32_ExpectingNativeFloatArray(void)

{
  return;
}

Assistant:

Var JavascriptNativeOperators::OP_GetElementI_UInt32_ExpectingVarArray(Var instance, uint32 index, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_GetElementI_UInt32_ExpectingVarArray);
#if ENABLE_PROFILE_INFO
        JavascriptOperators::UpdateNativeArrayProfileInfoToCreateVarArray(instance, false, true);
#endif
        return JavascriptOperators::OP_GetElementI_UInt32(instance, index, scriptContext);
        JIT_HELPER_END(Op_GetElementI_UInt32_ExpectingVarArray);
    }